

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

wchar_t a_cmp_tval(void *a,void *b)

{
  artifact *paVar1;
  artifact *paVar2;
  wchar_t c;
  wchar_t tb;
  wchar_t ta;
  artifact *a_b;
  artifact *a_a;
  int b_val;
  int a_val;
  void *b_local;
  void *a_local;
  
  paVar1 = a_info + *a;
  paVar2 = a_info + *b;
  a_local._4_4_ = obj_group_order[paVar1->tval] - obj_group_order[paVar2->tval];
  if ((a_local._4_4_ == L'\0') &&
     (a_local._4_4_ = paVar1->sval - paVar2->sval, a_local._4_4_ == L'\0')) {
    a_local._4_4_ = strcmp(paVar1->name,paVar2->name);
  }
  return a_local._4_4_;
}

Assistant:

static int a_cmp_tval(const void *a, const void *b)
{
	const int a_val = *(const int *)a;
	const int b_val = *(const int *)b;
	const struct artifact *a_a = &a_info[a_val];
	const struct artifact *a_b = &a_info[b_val];

	/* Group by */
	int ta = obj_group_order[a_a->tval];
	int tb = obj_group_order[a_b->tval];
	int c = ta - tb;
	if (c) return c;

	/* Order by */
	c = a_a->sval - a_b->sval;
	if (c) return c;
	return strcmp(a_a->name, a_b->name);
}